

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessionwidget.cpp
# Opt level: O2

void __thiscall SessionWidget::~SessionWidget(SessionWidget *this)

{
  QDeadlineTimer QVar1;
  
  *(undefined ***)this = &PTR_metaObject_00199090;
  *(undefined **)&this->field_0x10 = &DAT_00199240;
  this->mCancel = true;
  if (this->mThread != (QThread *)0x0) {
    QThread::quit();
    QVar1.t2 = 0xffffffff;
    QVar1.type = 0x7fffffff;
    QVar1.t1 = (qint64)this->mThread;
    QThread::wait(QVar1);
    if (this->mThread != (QThread *)0x0) {
      (**(code **)(*(long *)this->mThread + 0x20))();
    }
  }
  this->mThread = (QThread *)0x0;
  operator_delete(this->ui,0x58);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->mAllFiles).d);
  QHash<int,_QHashDummyValue>::~QHash(&(this->mCanceled).q_hash);
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

SessionWidget::~SessionWidget()
{
    mCancel = true;
    if (mThread) {
        mThread->quit();
        mThread->wait();
    }
    delete mThread;
    mThread = nullptr;
    delete ui;
}